

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choice.c
# Opt level: O0

void choice_add(t_choice *x,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  t_elem_conflict *ptVar2;
  t_float tVar3;
  double local_58;
  t_float f;
  t_float normal;
  t_float sum;
  t_elem_conflict *e;
  int i;
  int newn;
  int oldn;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_choice *x_local;
  
  iVar1 = x->x_n;
  ptVar2 = (t_elem_conflict *)resizebytes(x->x_vec,(long)iVar1 * 0x2c,(long)(iVar1 + 1) * 0x2c);
  x->x_vec = ptVar2;
  x->x_n = iVar1 + 1;
  ptVar2 = x->x_vec + iVar1;
  ptVar2->e_age = 2.0;
  f = 0.0;
  for (e._4_4_ = 0; e._4_4_ < 10; e._4_4_ = e._4_4_ + 1) {
    tVar3 = atom_getfloatarg(e._4_4_,argc,argv);
    ptVar2->e_weight[e._4_4_] = tVar3;
    f = tVar3 * tVar3 + f;
  }
  if (f <= 0.0) {
    local_58 = 1.0;
  }
  else {
    local_58 = sqrt((double)f);
    local_58 = 1.0 / local_58;
  }
  for (e._4_4_ = 0; e._4_4_ < 10; e._4_4_ = e._4_4_ + 1) {
    ptVar2->e_weight[e._4_4_] = (float)local_58 * ptVar2->e_weight[e._4_4_];
  }
  return;
}

Assistant:

static void choice_add(t_choice *x, t_symbol *s, int argc, t_atom *argv)
{
    int oldn = x->x_n, newn = oldn + 1, i;
    t_elem *e;
    t_float sum, normal;
    x->x_vec = (t_elem *)resizebytes(x->x_vec, oldn * sizeof(t_elem),
        newn * sizeof(t_elem));
    x->x_n = newn;
    e = x->x_vec + oldn;
    e->e_age = 2;
    
    for (i = 0, sum = 0; i < DIMENSION; i++)
    {
        t_float f = atom_getfloatarg(i, argc, argv);
        e->e_weight[i] = f;
        sum += f*f;
    }
    normal = (t_float)(sum > 0 ? 1./sqrt(sum) : 1);
    for (i = 0; i < DIMENSION; i++)
        e->e_weight[i] *= normal;
}